

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_base64.c
# Opt level: O1

int assert_roundtrip(int flags,char *src)

{
  int iVar1;
  size_t srclen;
  size_t tmplen;
  char tmp [1500];
  size_t local_610;
  char local_608 [1512];
  
  srclen = strlen(src);
  base64_encode(src,srclen,out,&outlen,flags);
  iVar1 = base64_decode(out,outlen,local_608,&local_610,flags);
  if (iVar1 == 0) {
    printf("FAIL: decoding of \'%s\': decoding error\n",out);
  }
  else if (srclen == local_610) {
    iVar1 = strncmp(src,local_608,local_610);
    if (iVar1 == 0) {
      return 0;
    }
    local_608[local_610] = '\0';
    printf("FAIL: roundtrip of \'%s\': got \'%s\'\n",src,local_608);
  }
  else {
    printf("FAIL: roundtrip of \'%s\': length expected %lu, got %lu\n",src,srclen,local_610);
  }
  return 1;
}

Assistant:

static int
assert_roundtrip (int flags, const char *src)
{
	char tmp[1500];
	size_t tmplen;
	size_t srclen = strlen(src);

	// Encode the input into global buffer:
	base64_encode(src, srclen, out, &outlen, flags);

	// Decode the global buffer into local temp buffer:
	if (!base64_decode(out, outlen, tmp, &tmplen, flags)) {
		printf("FAIL: decoding of '%s': decoding error\n", out);
		return true;
	}

	// Check that 'src' is identical to 'tmp':
	if (srclen != tmplen) {
		printf("FAIL: roundtrip of '%s': "
			"length expected %lu, got %lu\n", src,
			(unsigned long)srclen,
			(unsigned long)tmplen
		);
		return true;
	}
	if (strncmp(src, tmp, tmplen) != 0) {
		tmp[tmplen] = '\0';
		printf("FAIL: roundtrip of '%s': got '%s'\n", src, tmp);
		return true;
	}

	return false;
}